

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fOcclusionQueryTests.cpp
# Opt level: O1

void deqp::gles3::Functional::generateVertices
               (vector<float,_std::allocator<float>_> *dst,float width,float height,
               int primitiveCount,int verticesPerPrimitive,Random *rnd,float primitiveSize,
               float minZ,float maxZ)

{
  pointer pfVar1;
  deRandom *rnd_00;
  undefined4 in_register_00000014;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  rnd_00 = (deRandom *)CONCAT44(in_register_00000014,verticesPerPrimitive);
  std::vector<float,_std::allocator<float>_>::resize(dst,(long)(primitiveCount * 0xc));
  if (0 < primitiveCount * 3) {
    fVar6 = width * 0.5;
    iVar5 = 0;
    iVar3 = 3;
    do {
      fVar7 = deRandom_getFloat(rnd_00);
      fVar8 = deRandom_getFloat(rnd_00);
      lVar4 = 3;
      iVar2 = iVar3;
      do {
        fVar9 = deRandom_getFloat(rnd_00);
        (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_start[iVar2 + -3] = fVar9 * (fVar6 + fVar6) + -fVar6 + fVar7 + fVar7 + -1.0;
        fVar9 = deRandom_getFloat(rnd_00);
        (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_start[iVar2 + -2] = fVar9 * (fVar6 + fVar6) + -fVar6 + fVar8 + fVar8 + -1.0;
        fVar9 = deRandom_getFloat(rnd_00);
        pfVar1 = (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar1[iVar2 + -1] = fVar9 * (primitiveSize - height) + height;
        pfVar1[iVar2] = 1.0;
        iVar2 = iVar2 + 4;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
      iVar5 = iVar5 + 3;
      iVar3 = iVar3 + 0xc;
    } while (iVar5 < primitiveCount * 3);
  }
  return;
}

Assistant:

static void generateVertices (std::vector<float>& dst, float width, float height, int primitiveCount, int verticesPerPrimitive, de::Random rnd, float primitiveSize, float minZ, float maxZ)
{
	float w = width/2.0f;
	float h = height/2.0f;
	float s = primitiveSize/2.0f;

	int vertexCount = verticesPerPrimitive * primitiveCount;
	dst.resize(vertexCount * ELEMENTS_PER_VERTEX);

	for (int i = 0; i < vertexCount; i += 3)			// First loop gets a random point inside unit square
	{
		float rndX = rnd.getFloat(-w, w);
		float rndY = rnd.getFloat(-h, h);

		for (int j = 0; j < verticesPerPrimitive; j++)	// Second loop gets 3 random points within given distance s from (rndX, rndY)
		{
			dst[(i+j)*ELEMENTS_PER_VERTEX    ] = rndX + rnd.getFloat(-s,s);	// x
			dst[(i+j)*ELEMENTS_PER_VERTEX + 1] = rndY + rnd.getFloat(-s,s);	// y
			dst[(i+j)*ELEMENTS_PER_VERTEX + 2] = rnd.getFloat(minZ, maxZ);	// z
			dst[(i+j)*ELEMENTS_PER_VERTEX + 3] = 1.0f;						// w
		}
	}
}